

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<short,_sptk::int24_t>::Run
          (DataTransform<short,_sptk::int24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  NumericType NVar4;
  WarningType WVar5;
  bool bVar6;
  char *__nptr;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  undefined8 uVar11;
  ostream *poVar12;
  size_t sVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int24_t *piVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar26;
  short input_data;
  string word;
  char buffer [128];
  short local_284;
  int24_t local_282;
  int24_t local_27f;
  ushort local_27c;
  short local_27a;
  int24_t *local_278;
  int24_t *local_270;
  istream *local_268;
  ulong local_260;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_270 = &this->minimum_value_;
  local_278 = &this->maximum_value_;
  local_238 = &this->print_format_;
  uVar25 = 0;
  local_268 = input_stream;
  do {
    iVar8 = (int)uVar25;
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(local_268,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar6 = true;
        bVar7 = false;
      }
      else {
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        *piVar10 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar11 = std::__throw_invalid_argument("stold");
LAB_001183f9:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar11);
        }
        if (*piVar10 == 0) {
          *piVar10 = iVar3;
        }
        else if (*piVar10 == 0x22) {
          uVar11 = std::__throw_out_of_range("stold");
          goto LAB_001183f9;
        }
        local_27c = in_FPUControlWord | 0xc00;
        local_284 = (short)ROUND(in_ST0);
        bVar6 = false;
        bVar7 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_27a = local_284;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar7) goto LAB_00118049;
      if (bVar6) {
        if (bVar6) {
LAB_0011839e:
          bVar7 = true;
          if ((this->is_ascii_output_ == true) && (iVar8 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_001183e3:
          bVar7 = false;
        }
        return bVar7;
      }
    }
    else {
      bVar7 = sptk::ReadStream<short>(&local_284,local_268);
      if (!bVar7) goto LAB_0011839e;
LAB_00118049:
      bVar15 = (this->minimum_value_).value[2];
      uVar19 = (uint)bVar15 * 0x10000;
      bVar16 = (this->minimum_value_).value[1];
      uVar21 = (uint)bVar16 * 0x100;
      uVar23 = (uint)(this->minimum_value_).value[0];
      uVar9 = uVar19 + uVar23 | uVar21;
      uVar22 = uVar9 | 0xff000000;
      if (-1 < (char)bVar15) {
        uVar22 = uVar9;
      }
      bVar1 = (this->maximum_value_).value[2];
      uVar14 = (uint)bVar1 * 0x10000;
      bVar2 = (this->maximum_value_).value[1];
      uVar17 = (uint)bVar2 * 0x100;
      uVar18 = (uint)(this->maximum_value_).value[0];
      uVar24 = uVar14 + uVar18 | uVar17;
      uVar9 = uVar24 | 0xff000000;
      if (-1 < (char)bVar1) {
        uVar9 = uVar24;
      }
      uVar24 = (uint)local_284;
      local_260 = uVar25;
      if ((int)uVar22 < (int)uVar9) {
        NVar4 = this->input_numeric_type_;
        piVar20 = local_270;
        if (NVar4 == kFloatingPoint) {
LAB_001180d9:
          uVar22 = (uVar21 - 0x1000000) + (uVar19 | uVar23);
          if (-1 < (char)bVar15) {
            uVar22 = uVar19 | uVar23 | uVar21;
          }
          if ((int)uVar22 <= (int)uVar24) {
            uVar22 = (uVar17 - 0x1000000) + (uVar14 | uVar18);
            if (-1 < (char)bVar1) {
              uVar22 = uVar14 | uVar18 | uVar17;
            }
            piVar20 = local_278;
            bVar16 = bVar2;
            bVar15 = bVar1;
            if ((int)uVar24 <= (int)uVar22) goto LAB_00118223;
          }
        }
        else {
          if (NVar4 != kUnsignedInteger) {
            if (NVar4 != kSignedInteger) goto LAB_00118223;
            goto LAB_001180d9;
          }
          uVar22 = (uVar21 - 0x1000000) + (uVar19 | uVar23);
          if (-1 < (char)bVar15) {
            uVar22 = uVar19 | uVar23 | uVar21;
          }
          if (uVar22 <= uVar24) {
            uVar22 = (uVar17 - 0x1000000) + (uVar14 | uVar18);
            if (-1 < (char)bVar1) {
              uVar22 = uVar14 | uVar18 | uVar17;
            }
            piVar20 = local_278;
            bVar16 = bVar2;
            bVar15 = bVar1;
            if (uVar24 <= uVar22) goto LAB_00118223;
          }
        }
        uVar24 = (uint)piVar20->value[0];
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar5 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar5 == kExit) goto LAB_001183e3;
        }
      }
      else {
LAB_00118223:
        if (this->rounding_ == true) {
          if (local_284 < 1) {
            dVar26 = (double)(int)uVar24 + -0.5;
          }
          else {
            dVar26 = (double)(int)uVar24 + 0.5;
          }
          uVar24 = (uint)dVar26;
          bVar16 = (byte)(uVar24 >> 8);
          bVar15 = (byte)(uVar24 >> 0x10);
        }
        else {
          bVar16 = (byte)((ushort)local_284 >> 8);
          bVar15 = (byte)(uVar24 >> 0xf);
        }
      }
      if (this->is_ascii_output_ == true) {
        local_27f.value[0] = (uint8_t)uVar24;
        local_27f.value[1] = bVar16;
        local_27f.value[2] = bVar15;
        bVar7 = sptk::SnPrintf<sptk::int24_t>(&local_27f,local_238,0x80,local_b8);
        if (!bVar7) goto LAB_001183e3;
        sVar13 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar13);
        if ((iVar8 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        local_282.value[0] = (uint8_t)uVar24;
        local_282.value[1] = bVar16;
        local_282.value[2] = bVar15;
        bVar7 = sptk::WriteStream<sptk::int24_t>(&local_282,(ostream *)&std::cout);
        if (!bVar7) goto LAB_001183e3;
      }
    }
    uVar25 = (ulong)(iVar8 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }